

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegratorCreator.hpp
# Opt level: O1

Integrator * __thiscall
OpenMD::IntegratorBuilder<OpenMD::NPTxyz>::create
          (IntegratorBuilder<OpenMD::NPTxyz> *this,SimInfo *info)

{
  NPT *this_00;
  
  this_00 = (NPT *)operator_new(0x328);
  NPT::NPT(this_00,info);
  memset(this_00 + 1,0,0x120);
  (this_00->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__NPTf_002fee60;
  return (Integrator *)this_00;
}

Assistant:

virtual Integrator* create(SimInfo* info) const {
      return new ConcreteIntegrator(info);
    }